

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O1

void freeexps(FuncState *fs,expdesc *e1,expdesc *e2)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = 0xffffffff;
  uVar2 = 0xffffffff;
  if (e1->k == VNONRELOC) {
    uVar2 = (e1->u).info;
  }
  if (e2->k == VNONRELOC) {
    uVar1 = (e2->u).info;
  }
  if ((int)uVar1 < (int)uVar2) {
    if (((uVar2 >> 8 & 1) == 0) && ((int)(uint)fs->nactvar <= (int)uVar2)) {
      fs->freereg = fs->freereg + 0xff;
    }
    if (((uVar1 >> 8 & 1) == 0) && ((int)(uint)fs->nactvar <= (int)uVar1)) {
LAB_001207dc:
      fs->freereg = fs->freereg + 0xff;
      return;
    }
  }
  else {
    if (((uVar1 >> 8 & 1) == 0) && ((int)(uint)fs->nactvar <= (int)uVar1)) {
      fs->freereg = fs->freereg + 0xff;
    }
    if (((uVar2 >> 8 & 1) == 0) && ((int)(uint)fs->nactvar <= (int)uVar2)) goto LAB_001207dc;
  }
  return;
}

Assistant:

static void freeexps(FuncState *fs, expdesc *e1, expdesc *e2) {
    int r1 = (e1->k == VNONRELOC) ? e1->u.info : -1;
    int r2 = (e2->k == VNONRELOC) ? e2->u.info : -1;
    if (r1 > r2) {
        freereg(fs, r1);
        freereg(fs, r2);
    } else {
        freereg(fs, r2);
        freereg(fs, r1);
    }
}